

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_csv_parser.cpp
# Opt level: O3

void __thiscall
csv::internals::IBasicCSVParser::IBasicCSVParser
          (IBasicCSVParser *this,CSVFormat *format,ColNamesPtr *col_names)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer pcVar2;
  pointer pcVar3;
  char cVar4;
  char cVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  array<csv::internals::ParseFlags,_256UL> ret;
  int local_430 [32];
  undefined1 auStack_3b0 [384];
  undefined4 auStack_230 [128];
  
  this->_vptr_IBasicCSVParser = (_func_int **)&PTR__IBasicCSVParser_001f7e08;
  (this->current_row).data.
  super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->current_row).data.
  super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->current_row).data_start = 0;
  (this->current_row).fields_start = 0;
  (this->current_row).row_length = 0;
  (this->data_ptr).super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->data_ptr).super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_col_names).super___shared_ptr<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (col_names->super___shared_ptr<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2>).
         _M_ptr;
  p_Var1 = (col_names->super___shared_ptr<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->_col_names).super___shared_ptr<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  this->fields = (CSVFieldList *)0x0;
  this->field_start = -1;
  this->field_length = 0;
  this->_eof = false;
  this->source_size = 0;
  this->quote_escape = false;
  this->field_has_double_quote = false;
  this->data_pos = 0;
  this->unicode_bom_scan = false;
  this->_utf8_bom = false;
  this->_records = (RowCollection *)0x0;
  if (format->no_quote == true) {
    cVar4 = CSVFormat::get_delim(format);
    lVar8 = 0x8a000000;
    lVar7 = 0;
    memset(local_430,0,0x400);
    do {
      iVar6 = (uint)(lVar8 == 0) * 3 + 4;
      if (lVar8 == -0x3000000) {
        iVar6 = 7;
      }
      if ((long)cVar4 + 0x80 == lVar7) {
        iVar6 = 6;
      }
      local_430[lVar7] = iVar6;
      lVar8 = lVar8 + -0x1000000;
      lVar7 = lVar7 + 1;
    } while (lVar8 != -0x76000000);
  }
  else {
    cVar5 = CSVFormat::get_delim(format);
    lVar7 = 0x8a000000;
    cVar4 = format->quote_char;
    lVar8 = 0;
    memset(local_430,0,0x400);
    do {
      iVar6 = (uint)(lVar7 == 0) * 3 + 4;
      if (lVar7 == -0x3000000) {
        iVar6 = 7;
      }
      if ((long)cVar5 + 0x80 == lVar8) {
        iVar6 = 6;
      }
      local_430[lVar8] = iVar6;
      lVar7 = lVar7 + -0x1000000;
      lVar8 = lVar8 + 1;
    } while (lVar7 != -0x76000000);
    auStack_230[cVar4] = 3;
  }
  memcpy(&this->_parse_flags,local_430,0x400);
  pcVar2 = (format->trim_chars).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar3 = (format->trim_chars).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  memset(local_430,0,0x100);
  lVar7 = -0x80;
  do {
    *(undefined1 *)(lVar7 + 0x80 + (long)local_430) = 0;
    if (pcVar3 != pcVar2) {
      lVar8 = 0;
      do {
        if ((int)lVar7 == (int)pcVar2[lVar8]) {
          auStack_3b0[lVar7] = 1;
        }
        lVar8 = lVar8 + 1;
      } while ((long)pcVar3 - (long)pcVar2 != lVar8);
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x80);
  memcpy(&this->_ws_flags,local_430,0x100);
  return;
}

Assistant:

CSV_INLINE IBasicCSVParser::IBasicCSVParser(
            const CSVFormat& format,
            const ColNamesPtr& col_names
        ) : _col_names(col_names) {
            if (format.no_quote) {
                _parse_flags = internals::make_parse_flags(format.get_delim());
            }
            else {
                _parse_flags = internals::make_parse_flags(format.get_delim(), format.quote_char);
            }

            _ws_flags = internals::make_ws_flags(
                format.trim_chars.data(), format.trim_chars.size()
            );
        }